

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

PipelineWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateComputePipeline
          (PipelineWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkComputePipelineCreateInfo *PipelineCI,VkPipelineCache cache,char *DebugName)

{
  VkResult errorCode;
  char local_71;
  string msg;
  char *DebugName_local;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  char *local_38;
  
  DebugName_local = DebugName;
  if (PipelineCI->sType != VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO",
               (char (*) [67])cache);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x10d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (DebugName == (char *)0x0) {
    DebugName = "";
    DebugName_local = "";
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  errorCode = (*vkCreateComputePipelines)
                        (this->m_VkDevice,cache,1,PipelineCI,this->m_VkAllocator,(VkPipeline *)&msg)
  ;
  if (errorCode != VK_SUCCESS) {
    local_71 = '\'';
    local_38 = VkResultToString(errorCode);
    Diligent::LogError<true,char[36],char_const*,char,char[17],char_const*>
              (false,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x115,(char (*) [36])"Failed to create compute pipeline \'",&DebugName_local,
               &local_71,(char (*) [17])"\nVK Error Code: ",&local_38);
    DebugName = DebugName_local;
  }
  if (*DebugName != '\0') {
    SetPipelineName(this->m_VkDevice,(VkPipeline)msg._M_dataplus._M_p,DebugName);
  }
  std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
            ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)
             &local_48,
             (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)this);
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_48;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_40;
  if (local_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __return_storage_ptr__->m_VkObject = (VkPipeline_T *)msg._M_dataplus._M_p;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
      __return_storage_ptr__->m_VkObject = (VkPipeline_T *)msg._M_dataplus._M_p;
      if (local_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
      __return_storage_ptr__->m_VkObject = (VkPipeline_T *)msg._M_dataplus._M_p;
    }
    msg._M_dataplus._M_p = (pointer)0x0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineWrapper VulkanLogicalDevice::CreateComputePipeline(const VkComputePipelineCreateInfo& PipelineCI,
                                                           VkPipelineCache                    cache,
                                                           const char*                        DebugName) const
{
    VERIFY_EXPR(PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkPipeline vkPipeline = VK_NULL_HANDLE;

    VkResult err = vkCreateComputePipelines(m_VkDevice, cache, 1, &PipelineCI, m_VkAllocator, &vkPipeline);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create compute pipeline '", DebugName, '\'');

    if (*DebugName != 0)
        SetPipelineName(m_VkDevice, vkPipeline, DebugName);

    return PipelineWrapper{GetSharedPtr(), std::move(vkPipeline)};
}